

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmRulePlaceholderExpander *pcVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  TargetType targetType;
  int iVar8;
  cmGlobalNinjaGenerator *pcVar9;
  string *psVar10;
  cmValue cVar11;
  pointer pbVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  char *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *pcVar15;
  long lVar16;
  string *linkCmd;
  pointer s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view source;
  string_view source_00;
  string linker;
  string responseFlag;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string lang;
  string cmakeLinkVar;
  string cmakeVarLang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string targetVersionMinor;
  string targetVersionMajor;
  string langFlags;
  string linkRuleName;
  string launcher;
  string linkerLauncher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string val;
  ostringstream majorStream;
  ostringstream minorStream;
  Names tgtNames;
  string local_8a8;
  string local_880;
  char *local_860;
  undefined8 local_858;
  undefined1 local_848 [32];
  cmRulePlaceholderExpander *local_828;
  string local_820;
  string local_800;
  string local_7e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7c0;
  TargetType local_7a4;
  cmRulePlaceholderExpander *local_7a0;
  undefined8 local_798;
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  _Base_ptr local_760;
  _Base_ptr local_758;
  undefined1 local_750 [24];
  _Base_ptr local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730;
  string local_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_700;
  undefined1 local_6f8 [24];
  string local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6c0;
  undefined8 local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b0;
  pointer local_6a0;
  pointer local_698;
  char local_690;
  undefined7 uStack_68f;
  char *pcStack_688;
  char *local_680;
  char *local_678;
  char local_670;
  undefined7 uStack_66f;
  _Base_ptr p_Stack_668;
  char *local_660;
  char *local_658;
  char local_650;
  undefined7 uStack_64f;
  _Base_ptr p_Stack_648;
  undefined1 local_640 [17];
  undefined7 uStack_62f;
  char acStack_628 [8];
  _Alloc_hider local_620;
  cmRulePlaceholderExpander *local_618;
  undefined1 local_610 [16];
  _Alloc_hider local_600;
  char *local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  _Alloc_hider local_5e0;
  char *local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  _Alloc_hider local_5c0;
  char *local_5b8;
  undefined1 local_5b0 [16];
  _Alloc_hider local_5a0;
  char *local_598;
  _Rb_tree_node_base local_590;
  _Rb_tree_node_base local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  _Alloc_hider local_540;
  char *local_538;
  undefined1 local_530 [16];
  bool local_520;
  char *local_518;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  undefined1 local_488 [17];
  undefined7 uStack_477;
  undefined1 auStack_470 [8];
  char *local_468;
  string *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_448;
  char *local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  _Alloc_hider local_428;
  char *local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  char *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  char *local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Alloc_hider local_3c8;
  char *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  char *local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  _Alloc_hider local_388;
  char *local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  bool local_368;
  undefined1 local_310 [32];
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  bool local_1f0;
  string local_198;
  string local_178;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  size_t local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_t local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  char *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  LanguageLinkerRule((string *)(local_750 + 0x10),this,config);
  pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar7 = cmGlobalNinjaGenerator::HasRule(pcVar9,(string *)(local_750 + 0x10));
  p_Var6 = local_738;
  if (!bVar7) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750._16_8_ == &local_730) {
      local_6b0._8_8_ = local_730._8_8_;
      local_6c0 = &local_6b0;
    }
    else {
      local_6c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_750._16_8_;
    }
    local_738 = (_Base_ptr)0x0;
    local_730._M_local_buf[0] = '\0';
    local_158._0_8_ = local_158 + 0x10;
    if (local_6c0 == &local_6b0) {
      local_158._24_8_ = local_6b0._8_8_;
    }
    else {
      local_158._0_8_ = local_6c0;
    }
    local_138._M_p = (pointer)&local_128;
    local_158._8_8_ = p_Var6;
    local_6b8 = 0;
    local_6b0._M_allocated_capacity = (ulong)(uint7)local_730._M_allocated_capacity._1_7_ << 8;
    local_130 = 0;
    local_128._M_local_buf[0] = '\0';
    local_118._M_p = (pointer)&local_108;
    local_110 = 0;
    local_108._M_local_buf[0] = '\0';
    local_f8._M_p = (pointer)&local_e8;
    local_f0 = (char *)0x0;
    local_e8._M_local_buf[0] = '\0';
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = (char *)0x0;
    local_c8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
    local_90 = (char *)0x0;
    local_88._M_local_buf[0] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = (char *)0x0;
    local_68._M_local_buf[0] = '\0';
    local_58._M_p = (pointer)&local_48;
    local_50 = (char *)0x0;
    local_48._M_local_buf[0] = '\0';
    local_38 = false;
    local_750._16_8_ = &local_730;
    local_6c0 = &local_6b0;
    memset(local_640,0,0x158);
    psVar10 = cmGeneratorTarget::GetName_abi_cxx11_
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
    local_640._0_8_ = (psVar10->_M_dataplus)._M_p;
    psVar10 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    local_640._8_8_ = (psVar10->_M_dataplus)._M_p;
    cmGeneratorTarget::GetLinkerTool
              (&local_8a8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    local_590._M_left = (_Base_ptr)local_8a8._M_dataplus._M_p;
    cmGeneratorTarget::GetLinkerLanguage
              (&local_820,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    local_610._0_8_ = local_820._M_dataplus._M_p;
    local_610._8_8_ = "$AIX_EXPORTS";
    bVar7 = cmLocalGenerator::IsSplitSwiftBuild
                      ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
    if (bVar7) {
      bVar7 = false;
    }
    else {
      cmGeneratorTarget::GetLinkerLanguage
                (&local_178,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      iVar8 = std::__cxx11::string::compare((char *)&local_178);
      bVar7 = iVar8 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar7) {
      local_538 = "$SWIFT_LIBRARY_NAME";
      local_530._0_8_ = "$SWIFT_MODULE";
      local_530._8_8_ = "$SWIFT_MODULE_NAME";
      local_518 = "$SWIFT_SOURCES";
      local_570._M_left = (_Base_ptr)0x8dcab8;
      local_5b0._8_8_ = "$FLAGS";
      local_570._M_right = (_Base_ptr)0x8dcac1;
    }
    local_848._0_8_ = local_848 + 0x10;
    local_848._8_8_ = (pointer)0x0;
    local_848[0x10] = '\0';
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)local_310,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    local_488._0_8_ = (pointer)0x6;
    local_488._8_8_ = "CMAKE_";
    stack0xfffffffffffffb88 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auStack_470 = (undefined1  [8])local_310._8_8_;
    local_468 = (char *)local_310._0_8_;
    views._M_len = 2;
    views._M_array = (iterator)local_488;
    local_460 = (string *)local_310;
    cmCatViews(&local_7e0,views);
    if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
      operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
    }
    bVar7 = cmGeneratorTarget::HasLinkDependencyFile
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,config);
    if (bVar7) {
      pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      local_488._0_8_ = local_7e0._M_string_length;
      local_488._8_8_ = local_7e0._M_dataplus._M_p;
      stack0xfffffffffffffb88 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      auStack_470 = (undefined1  [8])0x16;
      local_468 = "_LINKER_DEPFILE_FORMAT";
      local_460 = (string *)0x0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_488;
      cmCatViews((string *)local_310,views_00);
      cmMakefile::GetDefinition(pcVar1,(string *)local_310);
      if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
        operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
      }
      std::__cxx11::string::_M_assign((string *)&local_b8);
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x8dccda);
    }
    local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_800,local_7e0._M_dataplus._M_p,
               local_7e0._M_string_length + local_7e0._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_800);
    cVar11 = cmMakefile::GetDefinition
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                        &local_800);
    if (cVar11.Value == (string *)0x0) {
      std::__cxx11::string::_M_replace((ulong)local_848,0,(char *)local_848._8_8_,0x8ad345);
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_848);
    }
    if ((useResponseFile) && ((pointer)local_848._8_8_ != (pointer)0x0)) {
      std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,0x8dccba);
      std::__cxx11::string::_M_append(local_848,(ulong)local_98._M_p);
      pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      pcVar15 = "$in_newline";
      if (pcVar9->UsingGCCOnWindows != false) {
        pcVar15 = "$in";
      }
      std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,(ulong)pcVar15);
      bVar7 = CheckUseResponseFileForLibraries(this,&local_820);
      if (bVar7) {
        std::__cxx11::string::append((char *)&local_78);
        local_5f0._M_allocated_capacity = (size_type)"";
      }
      else {
        local_5f0._M_allocated_capacity = (size_type)"$LINK_PATH $LINK_LIBRARIES";
      }
      bVar7 = cmLocalGenerator::IsSplitSwiftBuild
                        ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
      lVar16 = 0x40;
      if (!bVar7) {
        cmGeneratorTarget::GetLinkerLanguage
                  (&local_198,
                   (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                   GeneratorTarget,config);
        iVar8 = std::__cxx11::string::compare((char *)&local_198);
        lVar16 = 0x40;
        if (iVar8 == 0) {
          lVar16 = 0x128;
        }
      }
      pbVar12 = (pointer)local_848._0_8_;
      if ((!bVar7) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2)) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        pbVar12 = (pointer)local_848._0_8_;
      }
    }
    else {
      local_600._M_p = "$in";
      lVar16 = 0x50;
      pbVar12 = (pointer)0x8dd815;
    }
    *(pointer *)(local_640 + lVar16) = pbVar12;
    local_5b8 = "$OBJECT_DIR";
    local_5f8 = "$TARGET_FILE";
    local_598 = "$SONAME_FLAG";
    local_590._0_8_ = "$SONAME";
    local_590._M_parent = (_Base_ptr)0x8dd830;
    stack0xfffffffffffff9d0 = "$TARGET_PDB";
    local_780._0_8_ = local_770;
    local_780._8_8_ = 0;
    local_770[0] = '\0';
    local_7a0 = (cmRulePlaceholderExpander *)local_790;
    local_798 = 0;
    local_790[0] = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               (int *)&local_760,(int *)&local_6e0);
    std::ostream::operator<<(local_488,(_Rb_tree_color)local_760);
    std::ostream::operator<<(local_310,(int)local_6e0._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_780,(string *)&local_880);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,
                      (ulong)(local_880.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_7a0,(string *)&local_880);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,
                      (ulong)(local_880.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
    std::ios_base::~ios_base((ios_base *)local_2a0._M_local_buf);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
    std::ios_base::~ios_base((ios_base *)local_418._M_local_buf);
    local_620._M_p = (pointer)local_780._0_8_;
    local_618 = local_7a0;
    local_5b0._8_8_ = "$FLAGS";
    local_590._M_right = (_Base_ptr)0x8dd5c4;
    local_570._0_8_ = "$MANIFESTS";
    local_760 = (_Base_ptr)local_750;
    local_758 = (_Base_ptr)0x0;
    local_750[0] = _S_red;
    if (targetType != EXECUTABLE) {
      std::__cxx11::string::append((char *)&local_760);
      local_570._M_parent = local_760;
    }
    cmCommonTargetGenerator::GetLinkerLauncher(&local_6e0,(cmCommonTargetGenerator *)this,config);
    local_700 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_6f8 + 8);
    local_6f8._0_8_ = (undefined1 *)0x0;
    local_6f8[8] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"RULE_LAUNCH_LINK","");
    cmLocalGenerator::GetRuleLauncher
              (&local_4a8,(cmLocalGenerator *)pcVar2,target,(string *)local_488,config);
    if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
      operator_delete((void *)local_488._0_8_,(ulong)(stack0xfffffffffffffb88 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_310._0_8_ = local_4a8._M_string_length;
      local_310._8_8_ = local_4a8._M_dataplus._M_p;
      local_310._16_8_ = (char *)0x0;
      unique0x00005300 = auStack_470;
      local_488._0_8_ = (pointer)0x0;
      local_488._8_8_ = &DAT_00000001;
      auStack_470[0] = 0x20;
      local_310._24_8_ = 1;
      local_2e8 = 0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_310;
      local_2f0._M_p = (pointer)unique0x00005300;
      cmCatViews(&local_880,views_01);
      std::__cxx11::string::operator=((string *)&local_700,(string *)&local_880);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_880._M_dataplus._M_p != &local_880.field_2) {
        operator_delete(local_880._M_dataplus._M_p,
                        (ulong)(local_880.field_2._M_allocated_capacity + 1));
      }
    }
    (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
      super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_828);
    local_7a4 = targetType;
    ComputeLinkCmd(&local_7c0,this,config);
    pbVar12 = local_7c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_7c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_7c0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_7c0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_488._0_8_ = local_6f8._0_8_;
        local_488._8_8_ = local_700;
        stack0xfffffffffffffb88 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_468 = (s->_M_dataplus)._M_p;
        auStack_470 = (undefined1  [8])s->_M_string_length;
        local_460 = (string *)0x0;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_488;
        cmCatViews((string *)local_310,views_02);
        std::__cxx11::string::operator=((string *)s,(string *)local_310);
        if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
          operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_828,
                   (cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,s,
                   (RuleVariables *)local_640);
        s = s + 1;
      } while (s != pbVar12);
    }
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<cmNinjaRemoveNoOpCommands>>
                        (local_7c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_7c0.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    pcVar3 = local_488 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_7c0,(iterator)__first._M_current,
               (iterator)
               local_7c0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_488._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"$PRE_LINK","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&local_7c0,
                     (const_iterator)
                     local_7c0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_488);
    if ((pointer)local_488._0_8_ != pcVar3) {
      operator_delete((void *)local_488._0_8_,(ulong)(stack0xfffffffffffffb88 + 1));
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_7c0,
               (char (*) [12])"$POST_BUILD");
    local_310._0_8_ = local_310 + 0x10;
    local_310._8_8_ = (char *)0x0;
    local_310._16_8_ = local_310._16_8_ & 0xffffffffffffff00;
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_488,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_7c0,
               config,config,(string *)local_310,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_138,(string *)local_488);
    if ((pointer)local_488._0_8_ != pcVar3) {
      operator_delete((void *)local_488._0_8_,(ulong)(stack0xfffffffffffffb88 + 1));
    }
    if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
      operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_4c8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    pcVar13 = GetVisibleTypeName(this);
    local_488._0_8_ = &DAT_00000011;
    local_488._8_8_ = "Rule for linking ";
    stack0xfffffffffffffb88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_470 = (undefined1  [8])local_4c8._M_string_length;
    local_468 = local_4c8._M_dataplus._M_p;
    pcVar15 = local_310 + 0x18;
    local_310._0_8_ = (pointer)0x0;
    local_310._8_8_ = &DAT_00000001;
    local_310[0x18] = 0x20;
    local_458._0_8_ = 1;
    local_448._M_p = (pointer)0x0;
    local_460 = &local_4c8;
    local_458._8_8_ = pcVar15;
    local_310._16_8_ = pcVar15;
    local_440 = (char *)strlen(pcVar13);
    local_438._8_8_ = 0;
    local_880.field_2._M_allocated_capacity = (long)&local_880.field_2 + 8;
    local_880._M_dataplus._M_p = (pointer)0x0;
    local_880._M_string_length = (size_type)&DAT_00000001;
    local_880.field_2._M_local_buf[8] = 0x2e;
    local_428._M_p = &DAT_00000001;
    local_418._M_allocated_capacity = 0;
    views_03._M_len = 5;
    views_03._M_array = (iterator)local_488;
    local_438._M_allocated_capacity = (size_type)pcVar13;
    local_420 = (char *)local_880.field_2._M_allocated_capacity;
    cmCatViews(&local_720,views_03);
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_720);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorTarget::GetLinkerLanguage
              (&local_720,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    pcVar13 = GetVisibleTypeName(this);
    local_488._0_8_ = (char *)0x8;
    local_488._8_8_ = "Linking ";
    stack0xfffffffffffffb88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_470 = (undefined1  [8])local_720._M_string_length;
    local_468 = local_720._M_dataplus._M_p;
    local_310._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_310._8_8_ = &DAT_00000001;
    local_310[0x18] = 0x20;
    local_458._0_8_ = 1;
    local_448._M_p = (pointer)0x0;
    local_460 = &local_720;
    local_458._8_8_ = pcVar15;
    local_310._16_8_ = pcVar15;
    local_440 = (char *)strlen(pcVar13);
    local_438._8_8_ = 0;
    local_428._M_p = (pointer)0xd;
    local_420 = " $TARGET_FILE";
    local_418._M_allocated_capacity = 0;
    views_04._M_len = 5;
    views_04._M_array = (iterator)local_488;
    local_438._M_allocated_capacity = (size_type)pcVar13;
    cmCatViews(&local_880,views_04);
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_880);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != &local_880.field_2) {
      operator_delete(local_880._M_dataplus._M_p,
                      (ulong)(local_880.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_720._M_dataplus._M_p != &local_720.field_2) {
      operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x8dd60e);
    pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7c0);
    if (local_828 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_828->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    targetType = local_7a4;
    if (local_700 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_6f8 + 8)) {
      operator_delete(local_700,CONCAT71(local_6f8._9_7_,local_6f8[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_6e0._M_dataplus._M_p._4_4_,(int)local_6e0._M_dataplus._M_p) !=
        &local_6e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_6e0._M_dataplus._M_p._4_4_,(int)local_6e0._M_dataplus._M_p),
                      local_6e0.field_2._0_8_ + 1);
    }
    if (local_760 != (_Base_ptr)local_750) {
      operator_delete(local_760,CONCAT71(local_750._1_7_,local_750[0]) + 1);
    }
    if (local_7a0 != (cmRulePlaceholderExpander *)local_790) {
      operator_delete(local_7a0,CONCAT71(local_790._1_7_,local_790[0]) + 1);
    }
    if ((pointer)local_780._0_8_ != (pointer)local_770) {
      operator_delete((void *)local_780._0_8_,CONCAT71(local_770._1_7_,local_770[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800._M_dataplus._M_p != &local_800.field_2) {
      operator_delete(local_800._M_dataplus._M_p,
                      CONCAT71(local_800.field_2._M_allocated_capacity._1_7_,
                               local_800.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
      operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
      operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != &local_820.field_2) {
      operator_delete(local_820._M_dataplus._M_p,
                      CONCAT71(local_820.field_2._M_allocated_capacity._1_7_,
                               local_820.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
      operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_158);
  }
  TargetNames((Names *)local_158,this,config);
  if (((local_130 != local_110) ||
      ((local_130 != 0 && (iVar8 = bcmp(local_138._M_p,local_118._M_p,local_130), iVar8 != 0)))) &&
     (bVar7 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar7)) {
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    source._M_str = (psVar10->_M_dataplus)._M_p;
    source._M_len = psVar10->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)local_310,(cmOutputConverter *)pcVar2,source,SHELL,false);
    if (targetType == EXECUTABLE) {
      local_660 = &local_650;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_660,"CMAKE_SYMLINK_EXECUTABLE","");
      local_488._0_8_ = local_488 + 0x10;
      if (local_660 == &local_650) {
        auStack_470 = (undefined1  [8])p_Stack_648;
      }
      else {
        local_488._0_8_ = local_660;
      }
      uStack_477 = uStack_64f;
      local_488[0x10] = local_650;
      local_468 = (char *)&local_458;
      local_488._8_8_ = local_658;
      local_658 = (char *)0x0;
      local_650 = '\0';
      local_460 = (string *)0x0;
      local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
      local_448._M_p = (pointer)&local_438;
      local_440 = (char *)0x0;
      local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
      local_428._M_p = (pointer)&local_418;
      local_420 = (char *)0x0;
      local_418._M_allocated_capacity = local_418._M_allocated_capacity & 0xffffffffffffff00;
      local_408._M_p = (pointer)&local_3f8;
      local_400 = (char *)0x0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = (char *)0x0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8._M_p = (pointer)&local_3b8;
      local_3c0 = (char *)0x0;
      local_3b8._M_local_buf[0] = '\0';
      local_3a8._M_p = (pointer)&local_398;
      local_3a0 = (char *)0x0;
      local_398._M_local_buf[0] = '\0';
      local_388._M_p = (pointer)&local_378;
      local_380 = (char *)0x0;
      local_378._M_local_buf[0] = '\0';
      local_368 = false;
      local_8a8.field_2._M_allocated_capacity = 0;
      local_8a8._M_dataplus._M_p = (pointer)0x0;
      local_8a8._M_string_length = 0;
      pcVar3 = local_640 + 0x10;
      local_660 = &local_650;
      local_640._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_640,local_310._0_8_,(pointer)(local_310._8_8_ + local_310._0_8_));
      std::__cxx11::string::append(local_640);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640);
      if ((pointer)local_640._0_8_ != pcVar3) {
        operator_delete((void *)local_640._0_8_,(ulong)((long)stack0xfffffffffffff9d0 + 1));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8a8,
                 (char (*) [12])"$POST_BUILD");
      local_880._M_string_length = 0;
      local_880.field_2._M_allocated_capacity =
           local_880.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_640,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_8a8,config,config,&local_880,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_468,(string *)local_640);
      if ((pointer)local_640._0_8_ != pcVar3) {
        operator_delete((void *)local_640._0_8_,(ulong)((long)stack0xfffffffffffff9d0 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_880._M_dataplus._M_p != &local_880.field_2) {
        operator_delete(local_880._M_dataplus._M_p,
                        (ulong)(local_880.field_2._M_allocated_capacity + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_8a8);
      std::__cxx11::string::_M_replace((ulong)&local_448,0,local_440,0x8dd8ba);
      std::__cxx11::string::_M_replace((ulong)&local_428,0,local_420,0x8dd8db);
      pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_488);
    }
    else {
      local_680 = &local_670;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_680,"CMAKE_SYMLINK_LIBRARY","");
      local_488._0_8_ = local_488 + 0x10;
      if (local_680 == &local_670) {
        auStack_470 = (undefined1  [8])p_Stack_668;
      }
      else {
        local_488._0_8_ = local_680;
      }
      uStack_477 = uStack_66f;
      local_488[0x10] = local_670;
      local_468 = (char *)&local_458;
      local_488._8_8_ = local_678;
      local_678 = (char *)0x0;
      local_670 = '\0';
      local_460 = (string *)0x0;
      local_458._0_8_ = local_458._0_8_ & 0xffffffffffffff00;
      local_448._M_p = (pointer)&local_438;
      local_440 = (char *)0x0;
      local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
      local_428._M_p = (pointer)&local_418;
      local_420 = (char *)0x0;
      local_418._M_allocated_capacity = local_418._M_allocated_capacity & 0xffffffffffffff00;
      local_408._M_p = (pointer)&local_3f8;
      local_400 = (char *)0x0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = (char *)0x0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8._M_p = (pointer)&local_3b8;
      local_3c0 = (char *)0x0;
      local_3b8._M_local_buf[0] = '\0';
      local_3a8._M_p = (pointer)&local_398;
      local_3a0 = (char *)0x0;
      local_398._M_local_buf[0] = '\0';
      local_388._M_p = (pointer)&local_378;
      local_380 = (char *)0x0;
      local_378._M_local_buf[0] = '\0';
      local_368 = false;
      local_8a8.field_2._M_allocated_capacity = 0;
      local_8a8._M_dataplus._M_p = (pointer)0x0;
      local_8a8._M_string_length = 0;
      pcVar3 = local_640 + 0x10;
      local_680 = &local_670;
      local_640._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_640,local_310._0_8_,(pointer)(local_310._8_8_ + local_310._0_8_));
      std::__cxx11::string::append(local_640);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640);
      if ((pointer)local_640._0_8_ != pcVar3) {
        operator_delete((void *)local_640._0_8_,(ulong)((long)stack0xfffffffffffff9d0 + 1));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_8a8,
                 (char (*) [12])"$POST_BUILD");
      local_880._M_string_length = 0;
      local_880.field_2._M_allocated_capacity =
           local_880.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_640,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_8a8,config,config,&local_880,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_468,(string *)local_640);
      if ((pointer)local_640._0_8_ != pcVar3) {
        operator_delete((void *)local_640._0_8_,(ulong)((long)stack0xfffffffffffff9d0 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_880._M_dataplus._M_p != &local_880.field_2) {
        operator_delete(local_880._M_dataplus._M_p,
                        (ulong)(local_880.field_2._M_allocated_capacity + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_8a8);
      std::__cxx11::string::_M_replace((ulong)&local_448,0,local_440,0x8dd942);
      std::__cxx11::string::_M_replace((ulong)&local_428,0,local_420,0x8dd960);
      pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_488);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_488);
    if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
      operator_delete((void *)local_310._0_8_,(ulong)(local_310._16_8_ + 1));
    }
  }
  bVar7 = cmGeneratorTarget::IsApple
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if ((bVar7) &&
     (bVar7 = cmGeneratorTarget::HasImportLibrary
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,config), bVar7)) {
    TextStubsGeneratorRule(&local_4e8,this,config);
    local_310._0_8_ = local_310 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p == &local_4e8.field_2) {
      local_310._24_8_ = local_4e8.field_2._8_8_;
    }
    else {
      local_310._0_8_ = local_4e8._M_dataplus._M_p;
    }
    local_310._17_7_ = local_4e8.field_2._M_allocated_capacity._1_7_;
    local_310[0x10] = local_4e8.field_2._M_local_buf[0];
    local_2f0._M_p = (pointer)&local_2e0;
    local_310._8_8_ = local_4e8._M_string_length;
    local_4e8._M_string_length = 0;
    local_4e8.field_2._M_local_buf[0] = '\0';
    local_2e8 = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_2d0._M_allocated_capacity = (size_type)&local_2c0;
    local_2d0._8_8_ = (char *)0x0;
    local_2c0._M_local_buf[0] = '\0';
    local_2b0._M_p = (pointer)&local_2a0;
    local_2a8 = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_290._M_p = (pointer)&local_280;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_270._M_p = (pointer)&local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_250._M_p = (pointer)&local_240;
    local_248 = 0;
    local_240._M_local_buf[0] = '\0';
    local_230._M_p = (pointer)&local_220;
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_210._M_p = (pointer)&local_200;
    local_208 = 0;
    local_200._M_local_buf[0] = '\0';
    local_1f0 = false;
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)GetVisibleTypeName(this);
    local_488._0_8_ = (pointer)0x29;
    local_488._8_8_ = "Rule for generating text-based stubs for ";
    stack0xfffffffffffffb88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    auStack_470 = (undefined1  [8])strlen(paVar14->_M_local_buf);
    local_460 = (string *)0x0;
    unique0x00005300 = acStack_628;
    local_640._0_8_ = (char *)0x0;
    local_640._8_8_ = &DAT_00000001;
    acStack_628[0] = 0x2e;
    local_458._0_8_ = 1;
    local_448._M_p = (pointer)0x0;
    views_05._M_len = 3;
    views_05._M_array = (iterator)local_488;
    local_468 = (char *)paVar14;
    local_458._8_8_ = unique0x00005300;
    cmCatViews(&local_880,views_05);
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_880);
    paVar14 = &local_880.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != paVar14) {
      operator_delete(local_880._M_dataplus._M_p,
                      (ulong)(local_880.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::string::_M_replace((ulong)&local_2d0,0,(char *)local_2d0._8_8_,0x8dd9ad);
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"CMAKE_CREATE_TEXT_STUBS","");
    psVar10 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_488);
    if (psVar10 == (string *)0x0) {
      psVar10 = &cmValue::Empty_abi_cxx11_;
    }
    local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
    pcVar3 = (psVar10->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8a8,pcVar3,pcVar3 + psVar10->_M_string_length);
    if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
      operator_delete((void *)local_488._0_8_,(ulong)(stack0xfffffffffffffb88 + 1));
    }
    (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
      super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_7a0);
    memset(local_488,0,0x158);
    pcVar5 = local_7a0;
    local_440 = "$in";
    pcVar3 = local_640 + 0x10;
    local_640._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"$out","");
    std::__cxx11::string::_M_assign((string *)&pcVar5->TargetImpLib);
    if ((pointer)local_640._0_8_ != pcVar3) {
      operator_delete((void *)local_640._0_8_,(ulong)((long)stack0xfffffffffffff9d0 + 1));
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (local_7a0,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,
               &local_8a8,(RuleVariables *)local_488);
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_880._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_880,local_8a8._M_dataplus._M_p,
               local_8a8._M_dataplus._M_p + local_8a8._M_string_length);
    __l._M_len = 1;
    __l._M_array = &local_880;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_848,__l,(allocator_type *)&local_7e0);
    paVar4 = &local_820.field_2;
    local_820._M_string_length = 0;
    local_820.field_2._M_local_buf[0] = '\0';
    local_820._M_dataplus._M_p = (pointer)paVar4;
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_640,pcVar2,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_848,config,config,&local_820,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_2f0,(string *)local_640);
    if ((pointer)local_640._0_8_ != pcVar3) {
      operator_delete((void *)local_640._0_8_,(ulong)((long)stack0xfffffffffffff9d0 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_820._M_dataplus._M_p != paVar4) {
      operator_delete(local_820._M_dataplus._M_p,
                      CONCAT71(local_820.field_2._M_allocated_capacity._1_7_,
                               local_820.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_848);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_880._M_dataplus._M_p != paVar14) {
      operator_delete(local_880._M_dataplus._M_p,
                      (ulong)(local_880.field_2._M_allocated_capacity + 1));
    }
    pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_310);
    if (((local_f0 != local_d0) ||
        ((local_f0 != (char *)0x0 &&
         (iVar8 = bcmp(local_f8._M_p,local_d8._M_p,(size_t)local_f0), iVar8 != 0)))) &&
       (bVar7 = cmGeneratorTarget::IsFrameworkOnApple
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget), !bVar7)) {
      local_6a0 = &local_690;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6a0,"CMAKE_SYMLINK_IMPORT_LIBRARY","");
      if (local_6a0 == &local_690) {
        acStack_628 = (char  [8])pcStack_688;
        local_640._0_8_ = pcVar3;
      }
      else {
        local_640._0_8_ = local_6a0;
      }
      uStack_62f = uStack_68f;
      local_640[0x10] = local_690;
      local_620._M_p = local_610;
      local_640._8_8_ = local_698;
      local_698 = (pointer)0x0;
      local_690 = '\0';
      local_618 = (cmRulePlaceholderExpander *)0x0;
      local_610._0_8_ = local_610._0_8_ & 0xffffffffffffff00;
      local_600._M_p = (pointer)&local_5f0;
      local_5f8 = (char *)0x0;
      local_5f0._M_allocated_capacity = local_5f0._M_allocated_capacity & 0xffffffffffffff00;
      local_5e0._M_p = (pointer)&local_5d0;
      local_5d8 = (char *)0x0;
      local_5d0._M_local_buf[0] = '\0';
      local_5c0._M_p = local_5b0;
      local_5b8 = (char *)0x0;
      local_5b0[0] = '\0';
      local_5a0._M_p = (pointer)&local_590;
      local_598 = (char *)0x0;
      local_590._0_8_ = local_590._0_8_ & 0xffffffffffffff00;
      local_590._M_left = &local_570;
      local_590._M_right = (_Base_ptr)0x0;
      local_570._0_8_ = local_570._0_8_ & 0xffffffffffffff00;
      local_570._M_left = (_Base_ptr)&local_550;
      local_570._M_right = (_Base_ptr)0x0;
      local_550._M_local_buf[0] = '\0';
      local_540._M_p = local_530;
      local_538 = (char *)0x0;
      local_530._0_8_ = local_530._0_8_ & 0xffffffffffffff00;
      local_520 = false;
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      local_6a0 = &local_690;
      psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      source_00._M_str = (psVar10->_M_dataplus)._M_p;
      source_00._M_len = psVar10->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_820,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
      local_880._M_dataplus._M_p = (pointer)local_820._M_string_length;
      local_880._M_string_length = (size_type)local_820._M_dataplus._M_p;
      local_880.field_2._M_allocated_capacity = 0;
      local_880.field_2._8_8_ = 0x2a;
      local_860 = " -E cmake_symlink_library $in $SONAME $out";
      local_858 = 0;
      views_06._M_len = 2;
      views_06._M_array = (iterator)&local_880;
      cmCatViews((string *)local_848,views_06);
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7e0,local_848._0_8_,
                 (char *)((long)&((_Alloc_hider *)local_848._8_8_)->_M_p + local_848._0_8_));
      __l_00._M_len = 1;
      __l_00._M_array = &local_7e0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_780,__l_00,(allocator_type *)&local_760);
      local_800._M_string_length = 0;
      local_800.field_2._M_local_buf[0] = '\0';
      local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                (&local_880,pcVar2,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_780,config,config,&local_800,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_620,(string *)&local_880);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_880._M_dataplus._M_p != paVar14) {
        operator_delete(local_880._M_dataplus._M_p,
                        (ulong)(local_880.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_800._M_dataplus._M_p != &local_800.field_2) {
        operator_delete(local_800._M_dataplus._M_p,
                        CONCAT71(local_800.field_2._M_allocated_capacity._1_7_,
                                 local_800.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_780);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
        operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_848._0_8_ != (pointer)(local_848 + 0x10)) {
        operator_delete((void *)local_848._0_8_,CONCAT71(local_848._17_7_,local_848[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_820._M_dataplus._M_p != paVar4) {
        operator_delete(local_820._M_dataplus._M_p,
                        CONCAT71(local_820.field_2._M_allocated_capacity._1_7_,
                                 local_820.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_600,0,local_5f8,0x8dda01);
      std::__cxx11::string::_M_replace((ulong)&local_5e0,0,local_5d8,0x8dda26);
      pcVar9 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar9,(cmNinjaRule *)local_640);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_640);
    }
    if (local_7a0 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_7a0->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
      operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_310);
  }
  cmGeneratorTarget::Names::~Names((Names *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._16_8_ != &local_730) {
    operator_delete((void *)local_750._16_8_,
                    CONCAT71(local_730._M_allocated_capacity._1_7_,local_730._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string linker = this->GetGeneratorTarget()->GetLinkerTool(config);
    vars.Linker = linker.c_str();
    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
        this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    if (this->GeneratorTarget->HasLinkDependencyFile(config)) {
      auto DepFileFormat = this->GetMakefile()->GetDefinition(
        cmStrCat(cmakeVarLang, "_LINKER_DEPFILE_FORMAT"));
      rule.DepType = DepFileFormat;
      rule.DepFile = "$DEP_FILE";
    }

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // If libraries in rsp is enable
      if (this->CheckUseResponseFileForLibraries(lang)) {
        rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }

  if (this->GetGeneratorTarget()->IsApple() &&
      this->GetGeneratorTarget()->HasImportLibrary(config)) {
    cmNinjaRule rule(this->TextStubsGeneratorRule(config));
    rule.Comment = cmStrCat("Rule for generating text-based stubs for ",
                            this->GetVisibleTypeName(), '.');
    rule.Description = "Creating text-based stubs $out";

    std::string cmd =
      this->GetMakefile()->GetDefinition("CMAKE_CREATE_TEXT_STUBS");
    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.Target = "$in";
    rulePlaceholderExpander->SetTargetImpLib("$out");
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                 cmd, vars);

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine({ cmd }, config, config);
    this->GetGlobalGenerator()->AddRule(rule);

    if (tgtNames.ImportOutput != tgtNames.ImportReal &&
        !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
      cmNinjaRule slRule("CMAKE_SYMLINK_IMPORT_LIBRARY");
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        std::string slCmd =
          cmStrCat(cmakeCommand, " -E cmake_symlink_library $in $SONAME $out");
        slRule.Command = this->GetLocalGenerator()->BuildCommandLine(
          { slCmd }, config, config);
      }
      slRule.Description = "Creating import library symlink $out";
      slRule.Comment = "Rule for creating import library symlink.";
      this->GetGlobalGenerator()->AddRule(slRule);
    }
  }
}